

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcombobox_p.cpp
# Opt level: O3

void QComboBoxPrivateContainer::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  long lVar2;
  long in_FS_OFFSET;
  void *local_18;
  void *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    lVar2 = *(long *)((long)_a[1] + 8);
    if (pcVar1 == itemSelected && lVar2 == 0) {
      *(undefined4 *)*_a = 0;
    }
    else if (pcVar1 == resetButton && lVar2 == 0) {
      *(undefined4 *)*_a = 1;
    }
    goto switchD_003ddab0_default;
  }
  if (_c != InvokeMetaMethod) goto switchD_003ddab0_default;
  switch(_id) {
  case 0:
    local_10 = _a[1];
    local_18 = (void *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,0,&local_18);
  default:
switchD_003ddab0_default:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      return;
    }
    break;
  case 1:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      QMetaObject::activate(_o,&staticMetaObject,1,(void **)0x0);
      return;
    }
    break;
  case 2:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      scrollItemView((QComboBoxPrivateContainer *)_o,*_a[1]);
      return;
    }
    break;
  case 3:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      hideScrollers((QComboBoxPrivateContainer *)_o);
      return;
    }
    break;
  case 4:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      updateScrollers((QComboBoxPrivateContainer *)_o);
      return;
    }
    break;
  case 5:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
      viewDestroyed((QComboBoxPrivateContainer *)_o);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivateContainer::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QComboBoxPrivateContainer *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->itemSelected((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 1: _t->resetButton(); break;
        case 2: _t->scrollItemView((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->hideScrollers(); break;
        case 4: _t->updateScrollers(); break;
        case 5: _t->viewDestroyed(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QComboBoxPrivateContainer::*)(const QModelIndex & )>(_a, &QComboBoxPrivateContainer::itemSelected, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QComboBoxPrivateContainer::*)()>(_a, &QComboBoxPrivateContainer::resetButton, 1))
            return;
    }
}